

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O3

void __thiscall
Vault::KeyValue::KeyValue(KeyValue *this,Client *client,SecretMount *mount,Version version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->client_ = client;
  this->version_ = version;
  paVar1 = &(this->mount_).value_.field_2;
  (this->mount_).value_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (mount->value_)._M_dataplus._M_p;
  paVar2 = &(mount->value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(mount->value_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mount_).value_.field_2 + 8) = uVar4;
  }
  else {
    (this->mount_).value_._M_dataplus._M_p = pcVar3;
    (this->mount_).value_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mount_).value_._M_string_length = (mount->value_)._M_string_length;
  (mount->value_)._M_dataplus._M_p = (pointer)paVar2;
  (mount->value_)._M_string_length = 0;
  (mount->value_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Vault::KeyValue::KeyValue(const Vault::Client &client, Vault::SecretMount mount,
                          KeyValue::Version version)
    : client_(client)
    , version_(version)
    , mount_(std::move(mount)) {}